

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall despot::QNode::QNode(QNode *this,VNode *parent,int edge)

{
  int edge_local;
  VNode *parent_local;
  QNode *this_local;
  
  this->parent_ = parent;
  this->edge_ = edge;
  std::
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  ::map(&this->children_);
  this->vstar = (VNode *)0x0;
  return;
}

Assistant:

QNode::QNode(VNode* parent, int edge) :
	parent_(parent),
	edge_(edge),
	vstar(NULL) {
}